

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error ft_property_do(FT_Library library,FT_String *module_name,FT_String *property_name,
                       void *value,FT_Bool set,FT_Bool value_is_string)

{
  uint uVar1;
  FT_Module_Requester p_Var2;
  int iVar3;
  FT_Error FVar4;
  undefined8 *puVar5;
  long lVar6;
  FT_Module *ppFVar7;
  
  if (library == (FT_Library)0x0) {
    FVar4 = 0x21;
  }
  else if (value == (void *)0x0 ||
           (property_name == (FT_String *)0x0 || module_name == (FT_String *)0x0)) {
    FVar4 = 6;
  }
  else {
    ppFVar7 = library->modules;
    uVar1 = library->num_modules;
    lVar6 = (ulong)uVar1 << 3;
    while ((ppFVar7 < library->modules + uVar1 &&
           (iVar3 = strcmp((*ppFVar7)->clazz->module_name,module_name), iVar3 != 0))) {
      ppFVar7 = ppFVar7 + 1;
      lVar6 = lVar6 + -8;
    }
    if (lVar6 == 0) {
      FVar4 = 0xb;
    }
    else {
      p_Var2 = (*ppFVar7)->clazz->get_interface;
      FVar4 = 7;
      if (((p_Var2 != (FT_Module_Requester)0x0) &&
          (puVar5 = (undefined8 *)(*p_Var2)(*ppFVar7,"properties"), puVar5 != (undefined8 *)0x0)) &&
         (puVar5[set == '\0'] != 0)) {
        if (set == '\0') {
          FVar4 = (*(code *)puVar5[1])(*ppFVar7,property_name,value);
          return FVar4;
        }
        FVar4 = (*(code *)*puVar5)(*ppFVar7,property_name,value,value_is_string);
        return FVar4;
      }
    }
  }
  return FVar4;
}

Assistant:

static FT_Error
  ft_property_do( FT_Library        library,
                  const FT_String*  module_name,
                  const FT_String*  property_name,
                  void*             value,
                  FT_Bool           set,
                  FT_Bool           value_is_string )
  {
    FT_Module*           cur;
    FT_Module*           limit;
    FT_Module_Interface  interface;

    FT_Service_Properties  service;

#ifdef FT_DEBUG_LEVEL_ERROR
    const FT_String*  set_name  = "FT_Property_Set";
    const FT_String*  get_name  = "FT_Property_Get";
    const FT_String*  func_name = set ? set_name : get_name;
#endif

    FT_Bool  missing_func;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !module_name || !property_name || !value )
      return FT_THROW( Invalid_Argument );

    cur   = library->modules;
    limit = cur + library->num_modules;

    /* search module */
    for ( ; cur < limit; cur++ )
      if ( !ft_strcmp( cur[0]->clazz->module_name, module_name ) )
        break;

    if ( cur == limit )
    {
      FT_ERROR(( "%s: can't find module `%s'\n",
                 func_name, module_name ));
      return FT_THROW( Missing_Module );
    }

    /* check whether we have a service interface */
    if ( !cur[0]->clazz->get_interface )
    {
      FT_ERROR(( "%s: module `%s' doesn't support properties\n",
                 func_name, module_name ));
      return FT_THROW( Unimplemented_Feature );
    }

    /* search property service */
    interface = cur[0]->clazz->get_interface( cur[0],
                                              FT_SERVICE_ID_PROPERTIES );
    if ( !interface )
    {
      FT_ERROR(( "%s: module `%s' doesn't support properties\n",
                 func_name, module_name ));
      return FT_THROW( Unimplemented_Feature );
    }

    service = (FT_Service_Properties)interface;

    if ( set )
      missing_func = (FT_Bool)( !service->set_property );
    else
      missing_func = (FT_Bool)( !service->get_property );

    if ( missing_func )
    {
      FT_ERROR(( "%s: property service of module `%s' is broken\n",
                 func_name, module_name ));
      return FT_THROW( Unimplemented_Feature );
    }

    return set ? service->set_property( cur[0],
                                        property_name,
                                        value,
                                        value_is_string )
               : service->get_property( cur[0],
                                        property_name,
                                        value );
  }